

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O2

Territory __thiscall QTzTimeZonePrivate::territory(QTzTimeZonePrivate *this)

{
  Type *this_00;
  long in_FS_OFFSET;
  QTzTimeZone local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_tzZones>_>::operator->
                      ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_tzZones>_>
                        *)this);
  QHash<QByteArray,_QTzTimeZone>::value(&local_38,this_00,&(this->super_QTimeZonePrivate).m_id);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_38.comment.d);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return local_38.territory;
  }
  __stack_chk_fail();
}

Assistant:

QLocale::Territory QTzTimeZonePrivate::territory() const
{
    return tzZones->value(m_id).territory;
}